

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

bool __thiscall deqp::gles31::SSBOLayoutCase::execute(SSBOLayoutCase *this,deUint32 program)

{
  glBindBufferFunc p_Var1;
  glBufferDataFunc p_Var2;
  glBindBufferBaseFunc p_Var3;
  byte bVar4;
  int iVar5;
  GLuint index;
  deUint32 dVar6;
  GLenum GVar7;
  deBool dVar8;
  undefined4 extraout_var;
  TestError *pTVar9;
  ulong __n;
  size_type sVar10;
  reference pvVar11;
  TestLog *this_00;
  MessageBuilder *pMVar12;
  MessageBuilder local_318;
  int local_198 [2];
  int resCount;
  int refCount;
  void *mapPtr;
  undefined1 local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> emptyData;
  string local_160;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  byte local_e9;
  undefined1 local_e8 [7];
  bool isOk;
  Buffer acBuffer;
  undefined1 local_c0 [8];
  InterfaceBlockInfo acBufferInfo;
  InterfaceVariableInfo acVarInfo;
  deUint32 numPassedLoc;
  Functions *gl;
  deUint32 program_local;
  SSBOLayoutCase *this_local;
  Functions *gl_00;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  index = (*gl_00->getProgramResourceIndex)(program,0x92e1,"ac_numPassed");
  if (index == 0xffffffff) {
    glu::InterfaceVariableInfo::InterfaceVariableInfo
              ((InterfaceVariableInfo *)
               &acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    glu::getProgramInterfaceVariableInfo
              ((InterfaceVariableInfo *)
               &acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,gl_00,program,0x92e1,index);
  }
  if (acVarInfo.index == 0xffffffff) {
    glu::InterfaceBlockInfo::InterfaceBlockInfo((InterfaceBlockInfo *)local_c0);
  }
  else {
    glu::getProgramInterfaceBlockInfo
              ((InterfaceBlockInfo *)local_c0,gl_00,program,0x92c0,acVarInfo.index);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_e8,this->m_renderCtx);
  local_e9 = 1;
  if (index == 0xffffffff) {
    local_112 = 1;
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"No location for ac_numPassed found",&local_111);
    tcu::TestError::TestError(pTVar9,&local_110);
    local_112 = 0;
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (acBufferInfo.name.field_2._8_4_ == -1) {
    local_13a = 1;
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"ac_numPassed buffer index is GL_INVALID_INDEX",&local_139);
    tcu::TestError::TestError(pTVar9,&local_138);
    local_13a = 0;
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (acBufferInfo.index == 0) {
    emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"ac_numPassed buffer size = 0",
               (allocator<char> *)
               ((long)&emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    tcu::TestError::TestError(pTVar9,&local_160);
    emptyData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  __n = (ulong)acBufferInfo.index;
  mapPtr._7_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&mapPtr + 6));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,__n,
             (value_type_conflict5 *)((long)&mapPtr + 7),
             (allocator<unsigned_char> *)((long)&mapPtr + 6));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&mapPtr + 6));
  p_Var1 = gl_00->bindBuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e8);
  (*p_Var1)(0x92c0,dVar6);
  p_Var2 = gl_00->bufferData;
  sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,0);
  (*p_Var2)(0x92c0,sVar10,pvVar11,0x88e5);
  p_Var3 = gl_00->bindBufferBase;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e8);
  (*p_Var3)(0x92c0,acBufferInfo.name.field_2._8_4_,dVar6);
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"Setting up buffer for ac_numPassed failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa45);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  (*gl_00->useProgram)(program);
  (*gl_00->dispatchCompute)(1,1,1);
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"glDispatchCompute() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa4a);
  _resCount = (*gl_00->mapBufferRange)(0x92c0,0,(ulong)acBufferInfo.index,1);
  local_198[1] = 1;
  local_198[0] = 0;
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0xa52);
  while( true ) {
    dVar8 = ::deGetFalse();
    if ((dVar8 != 0) || (_resCount == (void *)0x0)) break;
    dVar8 = ::deGetFalse();
    if (dVar8 == 0) {
      local_198[0] = *(int *)((long)_resCount + (ulong)acVarInfo.type);
      (*gl_00->unmapBuffer)(0x92c0);
      GVar7 = (*gl_00->getError)();
      glu::checkError(GVar7,"glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                      ,0xa58);
      if (local_198[0] != 1) {
        this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_318,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<
                            (&local_318,(char (*) [23])"ERROR: ac_numPassed = ");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_198);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])0xf4afd9);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,local_198 + 1);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_318);
        local_e9 = 0;
      }
      GVar7 = (*gl_00->getError)();
      glu::checkError(GVar7,"Shader execution failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                      ,0xa61);
      bVar4 = local_e9;
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)local_e8);
      glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_c0);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo
                ((InterfaceVariableInfo *)
                 &acBufferInfo.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      return (bool)(bVar4 & 1);
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
             ,0xa53);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool SSBOLayoutCase::execute (deUint32 program)
{
	const glw::Functions&				gl				= m_renderCtx.getFunctions();
	const deUint32						numPassedLoc	= gl.getProgramResourceIndex(program, GL_UNIFORM, "ac_numPassed");
	const glu::InterfaceVariableInfo	acVarInfo		= numPassedLoc != GL_INVALID_INDEX ? glu::getProgramInterfaceVariableInfo(gl, program, GL_UNIFORM, numPassedLoc)
																						   : glu::InterfaceVariableInfo();
	const glu::InterfaceBlockInfo		acBufferInfo	= acVarInfo.atomicCounterBufferIndex != GL_INVALID_INDEX ? glu::getProgramInterfaceBlockInfo(gl, program, GL_ATOMIC_COUNTER_BUFFER, acVarInfo.atomicCounterBufferIndex)
																												 : glu::InterfaceBlockInfo();
	const glu::Buffer					acBuffer		(m_renderCtx);
	bool								isOk			= true;

	if (numPassedLoc == GL_INVALID_INDEX)
		throw tcu::TestError("No location for ac_numPassed found");

	if (acBufferInfo.index == GL_INVALID_INDEX)
		throw tcu::TestError("ac_numPassed buffer index is GL_INVALID_INDEX");

	if (acBufferInfo.dataSize == 0)
		throw tcu::TestError("ac_numPassed buffer size = 0");

	// Initialize atomic counter buffer.
	{
		vector<deUint8> emptyData(acBufferInfo.dataSize, 0);

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *acBuffer);
		gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, (glw::GLsizeiptr)emptyData.size(), &emptyData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, acBufferInfo.index, *acBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setting up buffer for ac_numPassed failed");
	}

	gl.useProgram(program);
	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	// Read back ac_numPassed data.
	{
		const void*	mapPtr		= gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, acBufferInfo.dataSize, GL_MAP_READ_BIT);
		const int	refCount	= 1;
		int			resCount	= 0;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER) failed");
		TCU_CHECK(mapPtr);

		resCount = *(const int*)((const deUint8*)mapPtr + acVarInfo.offset);

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER) failed");

		if (refCount != resCount)
		{
			m_testCtx.getLog() << TestLog::Message << "ERROR: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
			isOk = false;
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Shader execution failed");

	return isOk;
}